

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SudokuGitter.cpp
# Opt level: O1

void __thiscall SudokuGitter::SudokuGitter(SudokuGitter *this,uint elements)

{
  ostream *poVar1;
  ulong __n;
  double dVar2;
  double dVar3;
  double __x;
  allocator_type local_42;
  allocator_type local_41;
  double local_40;
  double local_38;
  vector<cell,_std::allocator<cell>_> local_30;
  
  __n = (ulong)elements;
  std::vector<cell,_std::allocator<cell>_>::vector(&local_30,__n,&local_41);
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::vector(&this->cells,__n,&local_30,&local_42);
  if (local_30.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  this->elements = elements;
  __x = (double)__n;
  dVar3 = SQRT(__x);
  dVar2 = dVar3;
  if (__x < 0.0) {
    local_40 = __x;
    local_38 = dVar3;
    dVar3 = sqrt(__x);
    dVar2 = local_38;
    __x = local_40;
  }
  this->quadWidth = (uint)((ulong)elements / ((long)dVar3 & 0xffffffffU));
  if (__x < 0.0) {
    dVar2 = sqrt(__x);
  }
  this->quadHeight = (uint)(long)dVar2;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Create sudoku with: ",0x14);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," elements.",10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"quad height: ",0xd);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," quad width:",0xc);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

SudokuGitter::SudokuGitter(const unsigned int elements) : elements(elements),
                                                          cells(elements, vector<cell>(elements)),
                                                          quadHeight(static_cast<const unsigned int>(std::sqrt(
                                                                  elements))),
                                                          quadWidth(
                                                                  elements / static_cast<const unsigned int>(std::sqrt(
                                                                          elements))) {
    cout << "Create sudoku with: " << elements << " elements." << endl;
    cout << "quad height: " << getQuadHeight() << " quad width:" << getQuadWidth() << endl;
}